

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

longdouble * __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::local_compute_reduced_cost<baryonyx::bit_array>
          (longdouble *__return_storage_ptr__,
          solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
          *this,int variable,bit_array *x)

{
  longdouble *plVar1;
  undefined1 local_30 [16];
  
  sparse_matrix<int>::column((sparse_matrix<int> *)local_30,(int)__return_storage_ptr__ + 0x10);
  for (; local_30._8_8_ != local_30._0_8_; local_30._8_8_ = local_30._8_8_ + 8) {
  }
  plVar1 = quadratic_cost_type<long_double>::operator()
                     (*(longdouble **)((long)__return_storage_ptr__ + 0x178),
                      (quadratic_cost_type<long_double> *)((ulong)this & 0xffffffff),variable,
                      (bit_array *)local_30._0_8_);
  return plVar1;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }